

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SentencePieceText::SharedDtor(SentencePieceText *this)

{
  ArenaStringPtr *in_RDI;
  string *in_stack_ffffffffffffff98;
  
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(in_RDI,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void SentencePieceText::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  text_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}